

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# labpack-reader.c
# Opt level: O2

uint32_t labpack_reader_begin_map(labpack_reader_t *reader)

{
  uint32_t uVar1;
  
  if (reader != (labpack_reader_t *)0x0) {
    if (reader->status == LABPACK_STATUS_OK) {
      uVar1 = mpack_expect_map(reader->decoder);
      labpack_reader_check_decoder(reader);
    }
    else {
      uVar1 = 0;
    }
    return uVar1;
  }
  __assert_fail("reader",
                "/workspace/llm4binary/github/license_all_cmakelists_25/fieldrndservices[P]labpack-c/src/labpack-reader.c"
                ,0x166,"uint32_t labpack_reader_begin_map(labpack_reader_t *)");
}

Assistant:

uint32_t
labpack_reader_begin_map(labpack_reader_t* reader)
{
    assert(reader);
    uint32_t count = 0;
    if (labpack_reader_is_ok(reader)) {
        count = mpack_expect_map(reader->decoder);
        labpack_reader_check_decoder(reader);
    }
    return count;
}